

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::GetSegmentList(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 *this,PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment)

{
  undefined4 *puVar1;
  SecondaryAllocator *pSVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar8;
  undefined8 *in_FS_OFFSET;
  
  iVar5 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar5 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x5e5,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  uVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAvailablePageCount(segment);
  uVar7 = segment->decommitPageCount;
  if (uVar6 == uVar7) {
    return (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
           0x0;
  }
  if (segment->freePageCount == 0 && uVar7 == 0) {
LAB_0025aaa5:
    pDVar8 = &this->fullSegments;
  }
  else {
    pSVar2 = (segment->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).secondaryAllocator
    ;
    if (pSVar2 != (SecondaryAllocator *)0x0) {
      iVar5 = (*pSVar2->_vptr_SecondaryAllocator[3])();
      if ((char)iVar5 == '\0') goto LAB_0025aaa5;
      uVar7 = segment->decommitPageCount;
    }
    if (uVar7 == 0) {
      uVar7 = segment->freePageCount;
      uVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAvailablePageCount
                        (segment);
      pDVar8 = &this->emptySegments;
      if (uVar7 != uVar6) {
        pDVar8 = &this->segments;
      }
    }
    else {
      pDVar8 = &this->decommitSegments;
    }
  }
  return pDVar8;
}

Assistant:

DListBase<TPageSegment> *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::GetSegmentList(TPageSegment * segment)
{
    Assert(!this->HasMultiThreadAccess());

    return
        (segment->IsAllDecommitted()) ? nullptr :
        (segment->IsFull()) ? &fullSegments :
        (segment->ShouldBeInDecommittedList()) ? &decommitSegments :
        (segment->IsEmpty()) ? &emptySegments :
        &segments;
}